

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Output::preflightKey
          (Output *this,char *Key,bool Required,bool SameAsDefault,bool *UseDefault,void **param_5)

{
  reference pIVar1;
  StringRef local_60;
  StringRef local_50;
  InState local_3c;
  void **ppvStack_38;
  InState State;
  void **param_5_local;
  bool *UseDefault_local;
  bool SameAsDefault_local;
  char *pcStack_20;
  bool Required_local;
  char *Key_local;
  Output *this_local;
  
  *UseDefault = false;
  if (((Required) || (!SameAsDefault)) || ((this->WriteDefaultValues & 1U) != 0)) {
    ppvStack_38 = param_5;
    param_5_local = (void **)UseDefault;
    UseDefault_local._6_1_ = SameAsDefault;
    UseDefault_local._7_1_ = Required;
    pcStack_20 = Key;
    Key_local = (char *)this;
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    local_3c = *pIVar1;
    if ((local_3c == inFlowMapFirstKey) || (local_3c == inFlowMapOtherKey)) {
      StringRef::StringRef(&local_50,pcStack_20);
      flowKey(this,local_50);
    }
    else {
      newLineCheck(this);
      StringRef::StringRef(&local_60,pcStack_20);
      paddedKey(this,local_60);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Output::preflightKey(const char *Key, bool Required, bool SameAsDefault,
                          bool &UseDefault, void *&) {
  UseDefault = false;
  if (Required || !SameAsDefault || WriteDefaultValues) {
    auto State = StateStack.back();
    if (State == inFlowMapFirstKey || State == inFlowMapOtherKey) {
      flowKey(Key);
    } else {
      newLineCheck();
      paddedKey(Key);
    }
    return true;
  }
  return false;
}